

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::genFilters
          (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           *__return_storage_ptr__,FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
          *messages,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *initial,deUint32 seed,int iterations)

{
  GLenum GVar1;
  pointer pMVar2;
  void *pvVar3;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *__x;
  deUint32 dVar4;
  deBool dVar5;
  pointer pMVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *extraout_RAX;
  _Rb_tree_color _Var10;
  _Rb_tree_color _Var11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  long lVar17;
  bool bVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> severities;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSources;
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  tempMessageIds;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSeverities;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempTypes;
  Random rng;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  void *local_1c0;
  value_type local_1b8;
  long local_188;
  uint local_17c;
  ulong local_178;
  void *local_170;
  long local_168;
  long local_160;
  void *local_158;
  long local_150;
  long local_148;
  void *local_140;
  long local_138;
  long local_130;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_128;
  undefined8 uStack_120;
  ulong local_110;
  ulong local_108;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_100;
  _Rb_tree_node_base local_c8;
  long local_a8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_a0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_70;
  deRandom local_40;
  
  dVar4 = deStringHash((char *)this);
  uVar15 = (dVar4 >> 0x10 ^ dVar4 ^ 0x3d) * 9;
  uVar15 = (uVar15 >> 4 ^ uVar15) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar15 >> 0xf ^ seed ^ uVar15);
  local_c8._M_color = _S_red;
  local_c8._M_parent = (_Rb_tree_node_base *)0x0;
  local_a8 = 0;
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar6 = (messages->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (messages->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_left = &local_c8;
  local_c8._M_right = &local_c8;
  if (pMVar6 == pMVar2) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,initial);
  }
  else {
    local_128 = initial;
    if ((int)((ulong)((long)pMVar2 - (long)pMVar6) >> 4) * -0x55555555 < 1) {
      local_188 = 0;
      local_1c0 = (void *)0x0;
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      do {
        pMVar6 = pMVar6 + lVar13;
        p_Var16 = &local_c8;
        if (local_c8._M_parent == (_Rb_tree_node_base *)0x0) {
LAB_013aaa08:
          if (p_Var16 != local_c8._M_left) {
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var16);
            _Var11 = p_Var7[1]._M_color;
            _Var10 = (pMVar6->id).source;
            goto LAB_013aaa20;
          }
LAB_013aaa24:
          bVar18 = true;
          if ((&local_c8 != p_Var16) &&
             (_Var10 = (pMVar6->id).source, p_Var16[1]._M_color <= _Var10)) {
            if (_Var10 == p_Var16[1]._M_color) {
              uVar15 = (pMVar6->id).type;
              if (*(uint *)&p_Var16[1].field_0x4 <= uVar15) {
                if (uVar15 != *(uint *)&p_Var16[1].field_0x4) goto LAB_013aaa70;
                bVar18 = (pMVar6->id).id < *(uint *)&p_Var16[1]._M_parent;
              }
            }
            else {
LAB_013aaa70:
              bVar18 = false;
            }
          }
          p_Var7 = (_Rb_tree_node_base *)operator_new(0x30);
          *(GLuint *)&p_Var7[1]._M_parent = (pMVar6->id).id;
          GVar1 = (pMVar6->id).type;
          p_Var7[1]._M_color = (pMVar6->id).source;
          *(GLenum *)&p_Var7[1].field_0x4 = GVar1;
          std::_Rb_tree_insert_and_rebalance(bVar18,p_Var7,p_Var16,&local_c8);
          local_a8 = local_a8 + 1;
        }
        else {
          _Var10 = (pMVar6->id).source;
          uVar15 = (pMVar6->id).type;
          p_Var9 = local_c8._M_parent;
          do {
            while( true ) {
              p_Var7 = p_Var9;
              _Var11 = p_Var7[1]._M_color;
              p_Var16 = p_Var7;
              if ((_Var11 <= _Var10) &&
                 ((_Var10 != _Var11 ||
                  ((*(uint *)&p_Var7[1].field_0x4 <= uVar15 &&
                   ((uVar15 != *(uint *)&p_Var7[1].field_0x4 ||
                    (*(uint *)&p_Var7[1]._M_parent <= (pMVar6->id).id)))))))) break;
              p_Var9 = p_Var7->_M_left;
              if (p_Var7->_M_left == (_Base_ptr)0x0) goto LAB_013aaa08;
            }
            p_Var9 = p_Var7->_M_right;
          } while (p_Var7->_M_right != (_Base_ptr)0x0);
LAB_013aaa20:
          if ((_Var11 < _Var10) ||
             ((_Var11 == _Var10 &&
              ((uVar15 = (pMVar6->id).type, *(uint *)&p_Var7[1].field_0x4 < uVar15 ||
               ((*(uint *)&p_Var7[1].field_0x4 == uVar15 &&
                (*(uint *)&p_Var7[1]._M_parent < (pMVar6->id).id)))))))) goto LAB_013aaa24;
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_100,(uint *)pMVar6);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_70,&(pMVar6->id).type);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_a0,&pMVar6->severity);
        p_Var9 = local_c8._M_left;
        lVar13 = lVar13 + 1;
        pMVar6 = (messages->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar13 < (int)((ulong)((long)(messages->
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar6) >> 4) * -0x55555555);
      if (local_c8._M_left == &local_c8) {
        local_188 = 0;
        local_1c0 = (void *)0x0;
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        lVar17 = 0;
        p_Var8 = local_c8._M_left;
        do {
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          lVar17 = lVar17 + -0xc;
          lVar13 = lVar13 + -1;
        } while (p_Var8 != &local_c8);
        if (0xaaaaaaaaaaaaaaa < (ulong)-lVar13) {
          std::__throw_length_error("cannot create std::vector larger than max_size()");
        }
        if (lVar13 == 0) {
          local_1c0 = (void *)0x0;
        }
        else {
          local_1c0 = operator_new(-lVar17);
        }
        pvVar3 = local_1c0;
        lVar13 = 0;
        do {
          *(undefined4 *)((long)pvVar3 + lVar13 + 8) = *(undefined4 *)&p_Var9[1]._M_parent;
          *(undefined8 *)((long)pvVar3 + lVar13) = *(undefined8 *)(p_Var9 + 1);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          lVar13 = lVar13 + 0xc;
        } while (p_Var9 != &local_c8);
        lVar13 = lVar13 + (long)pvVar3;
        local_188 = (long)pvVar3 - lVar17;
      }
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_170,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_100._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_100._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b8);
    __x = local_128;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_140,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_70._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_70._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b8);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_158,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_a0._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_a0._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,__x);
    local_110 = (lVar13 - (long)local_1c0 >> 2) * -0x5555555555555555;
    local_17c = (int)local_110 + 1;
    local_178 = 0;
    do {
      dVar4 = deRandom_getUint32(&local_40);
      lVar13 = local_168;
      pvVar3 = local_170;
      uVar15 = dVar4 % 9;
      if (uVar15 == 0) {
        dVar4 = deRandom_getUint32(&local_40);
        GVar1 = *(GLenum *)
                 ((long)local_170 +
                 (long)(int)((ulong)dVar4 % ((ulong)(lVar13 - (long)pvVar3) >> 2 & 0xffffffff)) * 4)
        ;
        dVar5 = deRandom_getBool(&local_40);
        local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b8.type = 0x1100;
        local_1b8.severity = 0x1100;
        local_1b8.source = GVar1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b8.ids,&local_1d8);
        local_1b8.enabled = dVar5 == 1;
        initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                   *)&local_1b8;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,(value_type *)initial);
LAB_013aae3b:
        if (local_1b8.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)((long)local_1b8.ids.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_1b8.ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
          operator_delete(local_1b8.ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)initial);
        }
        if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)((long)local_1d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_1d8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
          operator_delete(local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,(ulong)initial);
        }
      }
      else {
        if (uVar15 == 1) {
          dVar4 = deRandom_getUint32(&local_40);
          GVar1 = *(GLenum *)
                   ((long)local_140 + ((ulong)dVar4 % (ulong)(local_138 - (long)local_140 >> 2)) * 4
                   );
          dVar5 = deRandom_getBool(&local_40);
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b8.source = 0x1100;
          local_1b8.severity = 0x1100;
          local_1b8.type = GVar1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b8.ids,&local_1d8);
          local_1b8.enabled = dVar5 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b8;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          goto LAB_013aae3b;
        }
        if (uVar15 == 2) {
          dVar4 = deRandom_getUint32(&local_40);
          GVar1 = *(GLenum *)
                   ((long)local_158 + ((ulong)dVar4 % (ulong)(local_150 - (long)local_158 >> 2)) * 4
                   );
          dVar5 = deRandom_getBool(&local_40);
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b8.source = 0x1100;
          local_1b8.type = 0x1100;
          local_1b8.severity = GVar1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b8.ids,&local_1d8);
          local_1b8.enabled = dVar5 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b8;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          goto LAB_013aae3b;
        }
        dVar4 = deRandom_getUint32(&local_40);
        local_108 = (ulong)dVar4 % (ulong)local_17c;
        lVar13 = 4;
        iVar14 = 0;
        do {
          dVar5 = deRandom_getBool(&local_40);
          pvVar3 = local_1c0;
          uVar12 = (ulong)(long)((int)local_108 + iVar14) % local_110;
          local_128 = *(vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                        **)((long)local_1c0 + uVar12 * 0xc);
          uStack_120 = 0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(4);
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          *local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = *(uint *)((long)pvVar3 + uVar12 * 0xc + 8);
          local_1b8.source = (GLenum)local_128;
          local_1b8.type = (GLenum)((ulong)local_128 >> 0x20);
          local_1b8.severity = 0x1100;
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b8.ids,&local_1d8);
          local_1b8.enabled = dVar5 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b8;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          if (local_1b8.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       *)((long)local_1b8.ids.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_1b8.ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_1b8.ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)initial);
          }
          if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       *)((long)local_1d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_1d8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_1d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)initial);
          }
          iVar14 = iVar14 + 1;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      uVar15 = (int)local_178 + 1;
      local_178 = (ulong)uVar15;
    } while (uVar15 != 4);
    if (local_158 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_148 - (long)local_158);
      operator_delete(local_158,(ulong)initial);
    }
    pvVar3 = local_1c0;
    if (local_140 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_130 - (long)local_140);
      operator_delete(local_140,(ulong)initial);
    }
    if (local_170 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_160 - (long)local_170);
      operator_delete(local_170,(ulong)initial);
    }
    if (pvVar3 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_188 - (long)pvVar3);
      operator_delete(pvVar3,(ulong)initial);
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_a0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_100);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::_Identity<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::_Identity<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
              *)local_c8._M_parent,(_Link_type)initial);
  return extraout_RAX;
}

Assistant:

vector<FilterCase::MessageFilter> FilterCase::genFilters (const vector<MessageData>& messages, const vector<MessageFilter>& initial, deUint32 seed, int iterations) const
{
	de::Random				rng				(seed ^ deInt32Hash(deStringHash(getName())));

	set<MessageID>			tempMessageIds;
	set<GLenum>				tempSources;
	set<GLenum>				tempTypes;
	set<GLenum>				tempSeverities;

	if (messages.empty())
		return initial;

	for (int ndx = 0; ndx < int(messages.size()); ndx++)
	{
		const MessageData& msg = messages[ndx];

		tempMessageIds.insert(msg.id);
		tempSources.insert(msg.id.source);
		tempTypes.insert(msg.id.type);
		tempSeverities.insert(msg.severity);
	}

	{
		// Fetchable by index
		const vector<MessageID> messageIds	(tempMessageIds.begin(), tempMessageIds.end());
		const vector<GLenum>	sources		(tempSources.begin(), tempSources.end());
		const vector<GLenum>	types		(tempTypes.begin(), tempTypes.end());
		const vector<GLenum>	severities	(tempSeverities.begin(), tempSeverities.end());

		vector<MessageFilter>	filters		= initial;

		for (int iteration = 0; iteration < iterations; iteration++)
		{
			switch(rng.getInt(0, 8)) // Distribute so that per-message randomization (the default branch) is prevalent
			{
				case 0:
				{
					const GLenum	source	= sources[rng.getInt(0, int(sources.size()-1))];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(source, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 1:
				{
					const GLenum	type	= types[rng.getUint32()%types.size()];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, type, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 2:
				{
					const GLenum	severity	= severities[rng.getUint32()%severities.size()];
					const bool		enabled		= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, GL_DONT_CARE, severity, vector<GLuint>(), enabled));
					break;
				}

				default:
				{
					const int start = rng.getInt(0, int(messageIds.size()));

					for (int itr = 0; itr < 4; itr++)
					{
						const MessageID&	id		= messageIds[(start+itr)%messageIds.size()];
						const bool			enabled = rng.getBool();

						filters.push_back(MessageFilter(id.source, id.type, GL_DONT_CARE, vector<GLuint>(1, id.id), enabled));
					}
				}
			}
		}

		return filters;
	}
}